

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1gload.c
# Opt level: O2

FT_Error T1_Parse_Glyph(T1_Decoder_conflict decoder,FT_UInt glyph_index)

{
  FT_Incremental_InterfaceRec *pFVar1;
  FT_Error FVar2;
  undefined1 local_30 [8];
  FT_Data glyph_data;
  
  FVar2 = T1_Parse_Glyph_And_Get_Char_String
                    (decoder,glyph_index,(FT_Data *)local_30,&glyph_data.field_0xf);
  if ((FVar2 == 0) &&
     (pFVar1 = ((decoder->builder).face)->internal->incremental_interface,
     pFVar1 != (FT_Incremental_InterfaceRec *)0x0)) {
    (*pFVar1->funcs->free_glyph_data)(pFVar1->object,(FT_Data *)local_30);
  }
  return FVar2;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  T1_Parse_Glyph( T1_Decoder  decoder,
                  FT_UInt     glyph_index )
  {
    FT_Data   glyph_data;
    FT_Bool   force_scaling = FALSE;
    FT_Error  error         = T1_Parse_Glyph_And_Get_Char_String(
                                decoder, glyph_index, &glyph_data,
                                &force_scaling );


#ifdef FT_CONFIG_OPTION_INCREMENTAL

    if ( !error )
    {
      T1_Face  face = (T1_Face)decoder->builder.face;


      if ( face->root.internal->incremental_interface )
        face->root.internal->incremental_interface->funcs->free_glyph_data(
          face->root.internal->incremental_interface->object,
          &glyph_data );
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    return error;
  }